

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall icu_63::DecimalFormat::setMultiplier(DecimalFormat *this,int32_t multiplier)

{
  DecimalFormatProperties *pDVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  bool bVar5;
  
  iVar3 = multiplier + (uint)(multiplier == 0);
  iVar4 = 0;
  iVar2 = iVar3;
  do {
    if (iVar2 == 1) {
      iVar3 = 1;
      goto LAB_00242e96;
    }
    iVar4 = iVar4 + 1;
    bVar5 = (iVar2 / 10) * 10 == iVar2;
    iVar2 = iVar2 / 10;
  } while (bVar5);
  iVar4 = 0;
LAB_00242e96:
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  pDVar1->magnitudeMultiplier = iVar4;
  pDVar1->multiplier = iVar3;
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setMultiplier(int32_t multiplier) {
    if (multiplier == 0) {
        multiplier = 1;     // one being the benign default value for a multiplier.
    }

    // Try to convert to a magnitude multiplier first
    int delta = 0;
    int value = multiplier;
    while (value != 1) {
        delta++;
        int temp = value / 10;
        if (temp * 10 != value) {
            delta = -1;
            break;
        }
        value = temp;
    }
    if (delta != -1) {
        fields->properties->magnitudeMultiplier = delta;
        fields->properties->multiplier = 1;
    } else {
        fields->properties->magnitudeMultiplier = 0;
        fields->properties->multiplier = multiplier;
    }
    touchNoError();
}